

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype N_VMinLocal_ManyVector(N_Vector x)

{
  long *in_RDI;
  sunrealtype lmin;
  sunrealtype min;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  double local_38;
  double local_30;
  double local_20;
  long local_18;
  
  local_20 = 1.79769313486232e+308;
  for (local_18 = 0; local_18 < *(long *)*in_RDI; local_18 = local_18 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)(*in_RDI + 0x10) + local_18 * 8) + 8) + 0x150) == 0)
    {
      local_38 = (double)N_VMin(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_18 * 8));
      if (local_20 < local_38) {
        local_38 = local_20;
      }
      local_20 = local_38;
    }
    else {
      local_30 = (double)N_VMinLocal(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_18 * 8));
      if (local_20 < local_30) {
        local_30 = local_20;
      }
      local_20 = local_30;
    }
  }
  return local_20;
}

Assistant:

sunrealtype MVAPPEND(N_VMinLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype min, lmin;

  /* initialize output*/
  min = SUN_BIG_REAL;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvminlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvminlocal)
    {
      lmin = N_VMinLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;

      /* otherwise, call nvmin and accumulate to overall min */
    }
    else
    {
      lmin = N_VMin(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;
    }
  }

  return (min);
}